

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  LodePNGState state;
  uint error;
  LodePNGState *in_stack_00000430;
  uint in_stack_00000438;
  uint in_stack_0000043c;
  uchar *in_stack_00000440;
  size_t *in_stack_00000448;
  uchar **in_stack_00000450;
  undefined4 local_30;
  
  lodepng_state_init((LodePNGState *)0x353d05);
  lodepng_encode(in_stack_00000450,in_stack_00000448,in_stack_00000440,in_stack_0000043c,
                 in_stack_00000438,in_stack_00000430);
  lodepng_state_cleanup((LodePNGState *)0x353d82);
  return local_30;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
                               unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}